

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O3

void __thiscall
Object::makePolygons4Render
          (Object *this,Vector2d *obs,
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          *polygons)

{
  pointer pEVar1;
  iterator __position;
  _Elt_pointer pMVar2;
  _Elt_pointer pMVar3;
  Edge *eg;
  pointer pEVar4;
  pointer pvVar5;
  Vector3d *p;
  _Elt_pointer __args;
  _Map_pointer ppMVar6;
  
  pEVar4 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar1 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar4 != pEVar1) {
    do {
      if (pEVar4->valid != false) {
        __position._M_current =
             (polygons->
             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (polygons->
            super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          ::_M_realloc_insert<>(polygons,__position);
          pvVar5 = (polygons->
                   super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          ((__position._M_current)->
          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((__position._M_current)->
          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((__position._M_current)->
          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pvVar5 = (polygons->
                   super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (polygons->
          super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = pvVar5;
        }
        std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<double&,double&>
                  ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)(pvVar5 + -1),
                   (double *)obs,
                   (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                   m_data.array + 1);
        __args = (pEVar4->
                 super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ).
                 super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        pMVar2 = (pEVar4->
                 super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ).
                 super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (__args != pMVar2) {
          pMVar3 = (pEVar4->
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ).
                   super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last;
          ppMVar6 = (pEVar4->
                    super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ).
                    super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node;
          do {
            std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
            emplace_back<double_const&,double_const&>
                      ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)(pvVar5 + -1),
                       (double *)__args,
                       (__args->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data.array + 1);
            __args = __args + 1;
            if (__args == pMVar3) {
              __args = ppMVar6[1];
              ppMVar6 = ppMVar6 + 1;
              pMVar3 = __args + 0x15;
            }
          } while (__args != pMVar2);
        }
      }
      pEVar4 = pEVar4 + 1;
    } while (pEVar4 != pEVar1);
  }
  return;
}

Assistant:

void Object::makePolygons4Render(Eigen::Vector2d obs, std::vector<std::vector<cv::Point>>& polygons) const{
    for (const Edge& eg: edges) {
        if (eg.valid == false) continue;
        polygons.emplace_back();
        std::vector<cv::Point>& back = polygons.back();
        back.emplace_back(obs.x(), obs.y());
        for (const Eigen::Vector3d& p: eg) {
            back.emplace_back(p.x(), p.y());
        }
    }
}